

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O2

bool __thiscall
lzham::tsstack<lzham::task_pool::task,_16U>::pop
          (tsstack<lzham::task_pool::task,_16U> *this,task *obj)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  uint64 uVar4;
  void *pvVar5;
  undefined8 uVar6;
  
  spinlock::lock(&this->m_spinlock);
  iVar3 = this->m_top;
  if (0 < iVar3) {
    uVar1 = iVar3 - 1;
    this->m_top = uVar1;
    uVar4 = this->m_stack[uVar1].m_data;
    pvVar5 = this->m_stack[uVar1].m_pData_ptr;
    puVar2 = (undefined8 *)((long)&this->m_stack[uVar1].m_pData_ptr + 4);
    uVar6 = puVar2[1];
    *(undefined8 *)((long)&obj->m_pData_ptr + 4) = *puVar2;
    *(undefined8 *)((long)&obj->field_2 + 4) = uVar6;
    obj->m_data = uVar4;
    obj->m_pData_ptr = pvVar5;
  }
  spinlock::unlock(&this->m_spinlock);
  return 0 < iVar3;
}

Assistant:

inline bool pop(T& obj)
      {
         bool result = false;
         m_spinlock.lock();
         if (m_top > 0)
         {
            obj = m_stack[--m_top];
            result = true;
         }
         m_spinlock.unlock();
         return result;
      }